

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

int ON_ArePointsOnLine(int dim,bool is_rat,int count,int stride,double *point,ON_BoundingBox *bbox,
                      ON_Line *line,double tolerance)

{
  int iVar1;
  bool bVar2;
  ON_3dPoint *pOVar3;
  ulong uVar4;
  char *sFormat;
  int iVar5;
  int iVar6;
  undefined7 in_register_00000031;
  double *pdVar7;
  int iVar8;
  int i;
  double dVar9;
  double t;
  ON_3dPoint Q;
  double local_a0;
  double local_88;
  uint local_7c;
  ulong local_78;
  undefined4 local_70;
  int local_6c;
  ON_3dPoint local_68;
  double *local_50;
  ON_3dVector local_48;
  
  if (0 < count) {
    bVar2 = ON_Line::IsValid(line);
    if (bVar2) {
      bVar2 = ON_BoundingBox::IsValid(bbox);
      if (bVar2) {
        bVar2 = ON_IsValid(tolerance);
        if (tolerance < 0.0 || !bVar2) {
          sFormat = "tolerance parameter not valid";
          iVar8 = 0xfa;
        }
        else if (dim - 4U < 0xfffffffe) {
          sFormat = "dim parameter not valid";
          iVar8 = 0xff;
        }
        else if (point == (double *)0x0) {
          sFormat = "point parameter not valid";
          iVar8 = 0x104;
        }
        else if (stride < (int)((uint)is_rat + dim)) {
          sFormat = "stride parameter not valid";
          iVar8 = 0x109;
        }
        else {
          local_a0 = tolerance;
          local_50 = point;
          if ((tolerance == 0.0) && (!NAN(tolerance))) {
            local_a0 = ON_BoundingBox::Tolerance(bbox);
          }
          local_70 = (undefined4)CONCAT71(in_register_00000031,is_rat);
          local_68.z = ON_3dPoint::Origin.z;
          local_68.x = ON_3dPoint::Origin.x;
          local_68.y = ON_3dPoint::Origin.y;
          iVar8 = 2;
          local_7c = stride;
          local_6c = count;
          if (count != 1) {
            ON_BoundingBox::Diagonal(&local_48,bbox);
            dVar9 = ON_3dVector::Length(&local_48);
            iVar8 = 2 - (uint)(local_a0 < dVar9);
          }
          uVar4 = 0;
          do {
            local_78 = uVar4;
            pOVar3 = ON_BoundingBox::operator[](bbox,(int)uVar4);
            local_68.x = pOVar3->x;
            iVar6 = 0;
            do {
              pOVar3 = ON_BoundingBox::operator[](bbox,iVar6);
              local_68.y = pOVar3->y;
              i = 0;
              iVar5 = iVar8;
              do {
                pOVar3 = ON_BoundingBox::operator[](bbox,i);
                local_68.z = pOVar3->z;
                ON_Line::ClosestPointTo(line,&local_68,&local_88);
                ON_Line::PointAt((ON_3dPoint *)&local_48,line,local_88);
                dVar9 = ON_3dPoint::DistanceTo(&local_68,(ON_3dPoint *)&local_48);
                iVar1 = local_6c;
                iVar8 = 0;
                if (dVar9 <= local_a0) {
                  iVar8 = iVar5;
                }
              } while ((iVar8 != 0) && (bVar2 = i == 0, i = i + 1, iVar5 = iVar8, bVar2));
            } while ((iVar8 != 0) && (bVar2 = iVar6 == 0, iVar6 = iVar6 + 1, bVar2));
          } while ((iVar8 != 0) && (uVar4 = (ulong)((int)local_78 + 1), (int)local_78 == 0));
          if (iVar8 != 0) {
            return iVar8;
          }
          local_68.z = ON_3dPoint::Origin.z;
          local_68.x = ON_3dPoint::Origin.x;
          local_68.y = ON_3dPoint::Origin.y;
          iVar8 = 2;
          if (local_6c != 1) {
            ON_BoundingBox::Diagonal(&local_48,bbox);
            dVar9 = ON_3dVector::Length(&local_48);
            iVar8 = 2 - (uint)(local_a0 < dVar9);
          }
          if ((char)local_70 == '\0') {
            uVar4 = (ulong)local_7c;
            iVar6 = 1;
            if (1 < iVar1) {
              iVar6 = iVar1;
            }
            pdVar7 = local_50;
            do {
              memcpy(&local_68,pdVar7,(ulong)(uint)(dim << 3));
              ON_Line::ClosestPointTo(line,&local_68,&local_88);
              ON_Line::PointAt((ON_3dPoint *)&local_48,line,local_88);
              dVar9 = ON_3dPoint::DistanceTo(&local_68,(ON_3dPoint *)&local_48);
              if (local_a0 < dVar9) {
                return 0;
              }
              pdVar7 = pdVar7 + uVar4;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
            return iVar8;
          }
          iVar6 = 1;
          if (1 < iVar1) {
            iVar6 = iVar1;
          }
          local_78 = (ulong)local_7c << 3;
          pdVar7 = local_50;
          while( true ) {
            dVar9 = pdVar7[(uint)dim];
            if ((dVar9 == 0.0) && (!NAN(dVar9))) break;
            ON_ArrayScale(dim,1.0 / dVar9,pdVar7,&local_68.x);
            ON_Line::ClosestPointTo(line,&local_68,&local_88);
            ON_Line::PointAt((ON_3dPoint *)&local_48,line,local_88);
            dVar9 = ON_3dPoint::DistanceTo(&local_68,(ON_3dPoint *)&local_48);
            if (local_a0 < dVar9) {
              return 0;
            }
            pdVar7 = (double *)((long)pdVar7 + local_78);
            iVar6 = iVar6 + -1;
            if (iVar6 == 0) {
              return iVar8;
            }
          }
          sFormat = "rational point has zero weight";
          iVar8 = 299;
        }
      }
      else {
        sFormat = "bbox parameter not valid";
        iVar8 = 0xf5;
      }
    }
    else {
      sFormat = "line parameter not valid";
      iVar8 = 0xf0;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_line.cpp"
               ,iVar8,"",sFormat);
  }
  return 0;
}

Assistant:

int ON_ArePointsOnLine( // returns 0=no, 1 = yes, 2 = pointset is (to tolerance) a single point on the line
        int dim,     // 2 or 3
        bool is_rat,
        int count, 
        int stride, const double* point,
        const ON_BoundingBox& bbox, // if needed, use ON_GetBoundingBox(dim,is_rat,count,stride,point)
        const ON_Line& line,  // line to test
        double tolerance
        )
{
  double w;
  int i, j, k;

  if ( count < 1 )
    return 0;

  if ( !line.IsValid() )
  {
    ON_ERROR("line parameter not valid");
    return 0;
  }
  if ( !bbox.IsValid() )
  {
    ON_ERROR("bbox parameter not valid");
    return 0;
  }
  if ( !ON_IsValid(tolerance) || tolerance < 0.0 )
  {
    ON_ERROR("tolerance parameter not valid");
    return 0;
  }
  if ( dim < 2 || dim > 3 )
  {
    ON_ERROR("dim parameter not valid");
    return 0;
  }
  if ( 0 == point )
  {
    ON_ERROR("point parameter not valid");
    return 0;
  }
  if ( stride < (is_rat?(dim+1):dim) )
  {
    ON_ERROR("stride parameter not valid");
    return 0;
  }

  int rc = 0;

  if ( tolerance == 0.0 ) {
    tolerance = bbox.Tolerance();
  }

  ON_3dPoint Q(ON_3dPoint::Origin);

  // test bounding box to quickly detect the common coordinate axis cases
  rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
  for ( i = 0; rc && i < 2; i++ ) {
    Q.x = bbox[i].x;
    for ( j = 0; rc && j < 2; j++) {
      Q.y = bbox[j].y;
      for ( k = 0; rc && k < 2; k++) {
        Q.z = bbox[k].z;
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance )
          rc = 0;
      }
    }
  }

  if ( !rc ) {
    // test points one by one
    Q = ON_3dPoint::Origin;
    rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
    if ( is_rat ) {
      for ( i = 0; i < count; i++ ) {
        w = point[dim];
        if ( w == 0.0 ) {
          ON_ERROR("rational point has zero weight");
          return 0;
        }
        ON_ArrayScale( dim, 1.0/w, point, &Q.x );
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
    else {
      for ( i = 0; i < count; i++ ) {
        memcpy( &Q.x, point, dim*sizeof(Q.x) );
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
  }

  return rc;
}